

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereClauseInsert(WhereClause *pWC,Expr *p,u16 wtFlags)

{
  sqlite3 *db_00;
  LogEst LVar1;
  int iVar2;
  WhereTerm *pWVar3;
  WhereTerm *pWVar4;
  Expr *pEVar5;
  sqlite3 *db;
  WhereTerm *pOld;
  int idx;
  WhereTerm *pTerm;
  u16 wtFlags_local;
  Expr *p_local;
  WhereClause *pWC_local;
  
  if (pWC->nSlot <= pWC->nTerm) {
    pWVar4 = pWC->a;
    db_00 = pWC->pWInfo->pParse->db;
    pWVar3 = (WhereTerm *)sqlite3DbMallocRawNN(db_00,(long)pWC->nSlot << 7);
    pWC->a = pWVar3;
    if (pWC->a == (WhereTerm *)0x0) {
      if ((wtFlags & 1) != 0) {
        sqlite3ExprDelete(db_00,p);
      }
      pWC->a = pWVar4;
      return 0;
    }
    memcpy(pWC->a,pWVar4,(long)pWC->nTerm << 6);
    if (pWVar4 != pWC->aStatic) {
      sqlite3DbFree(db_00,pWVar4);
    }
    iVar2 = sqlite3DbMallocSize(db_00,pWC->a);
    pWC->nSlot = (int)((ulong)(long)iVar2 >> 6);
  }
  iVar2 = pWC->nTerm;
  pWC->nTerm = iVar2 + 1;
  pWVar4 = pWC->a + iVar2;
  if ((p == (Expr *)0x0) || ((p->flags & 0x40000) == 0)) {
    pWVar4->truthProb = 1;
  }
  else {
    LVar1 = sqlite3LogEst((long)p->iTable);
    pWVar4->truthProb = LVar1 + -0x10e;
  }
  pEVar5 = sqlite3ExprSkipCollate(p);
  pWVar4->pExpr = pEVar5;
  pWVar4->wtFlags = wtFlags;
  pWVar4->pWC = pWC;
  pWVar4->iParent = -1;
  memset(&pWVar4->eOperator,0,0x2c);
  return iVar2;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u16 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pWInfo->pParse->db;
    pWC->a = sqlite3DbMallocRawNN(db, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    if( pOld!=pWC->aStatic ){
      sqlite3DbFree(db, pOld);
    }
    pWC->nSlot = sqlite3DbMallocSize(db, pWC->a)/sizeof(pWC->a[0]);
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  if( p && ExprHasProperty(p, EP_Unlikely) ){
    pTerm->truthProb = sqlite3LogEst(p->iTable) - 270;
  }else{
    pTerm->truthProb = 1;
  }
  pTerm->pExpr = sqlite3ExprSkipCollate(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  memset(&pTerm->eOperator, 0,
         sizeof(WhereTerm) - offsetof(WhereTerm,eOperator));
  return idx;
}